

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O2

void __thiscall FIX::SessionID::~SessionID(SessionID *this)

{
  std::__cxx11::string::~string((string *)&this->m_frozenString);
  std::__cxx11::string::~string((string *)&this->m_sessionQualifier);
  FieldBase::~FieldBase((FieldBase *)&this->m_targetCompID);
  FieldBase::~FieldBase((FieldBase *)&this->m_senderCompID);
  FieldBase::~FieldBase((FieldBase *)this);
  return;
}

Assistant:

SessionID()
  {
    toString(m_frozenString);
  }